

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryMultiType
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,EBinaryMathOpCodes op)

{
  AsmJsType *this_00;
  AsmJsType *this_01;
  bool bVar1;
  RegSlot R0;
  ParseNode *pnode_00;
  ParseNode *pnode_01;
  EmitExpressionInfo EVar2;
  ulong uVar3;
  AsmJsCompilationException *this_02;
  char16 *pcVar4;
  char16 *pcVar5;
  ulong uVar6;
  EmitExpressionInfo local_40;
  EmitExpressionInfo rhsEmit;
  EmitExpressionInfo lhsEmit;
  
  pnode_00 = ParserWrapper::GetBinaryLeft(pnode);
  pnode_01 = ParserWrapper::GetBinaryRight(pnode);
  EVar2 = Emit(this,pnode_00);
  rhsEmit = EVar2;
  local_40 = Emit(this,pnode_01);
  if (op < BMO_MUL) {
    if ((EVar2.type.which_.which_ == Intish) && ((pnode_00->nop & ~knopName) == knopAdd)) {
      rhsEmit = (EmitExpressionInfo)((ulong)rhsEmit & 0xffffffff);
    }
    if ((((ulong)local_40 & 0xffffffff00000000) == 0xc00000000) &&
       ((pnode_01->nop & ~knopName) == knopAdd)) {
      local_40 = (EmitExpressionInfo)((ulong)local_40 & 0xffffffff);
    }
  }
  this_00 = &local_40.type;
  StartStatement(this,pnode);
  this_01 = &rhsEmit.type;
  bVar1 = AsmJsType::isInt(this_01);
  if (bVar1) {
    bVar1 = AsmJsType::isInt(this_00);
    if (bVar1) {
      bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&rhsEmit);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
        goto LAB_00864d8d;
      }
      bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_40);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_00864d8d;
      }
      bVar1 = AsmJsType::isSigned(this_01);
      if (bVar1) {
        bVar1 = AsmJsType::isSigned(this_00);
        uVar3 = (ulong)!bVar1;
      }
      else {
        uVar3 = 1;
      }
      if (op - BMO_DIV < 2) {
        bVar1 = AsmJsType::isSigned(this_01);
        if (bVar1) {
          bVar1 = AsmJsType::isSigned(this_00);
          if (bVar1) goto LAB_00864c00;
        }
        bVar1 = AsmJsType::isUnsigned(this_01);
        if (bVar1) {
          bVar1 = AsmJsType::isUnsigned(this_00);
          if (bVar1) goto LAB_00864c00;
        }
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        pcVar4 = AsmJsType::toChars(this_01);
        pcVar5 = AsmJsType::toChars(this_00);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,
                   L"arguments to / or %% must both be double?, float?, signed, or unsigned; %s and %s given"
                   ,pcVar4,pcVar5);
        goto LAB_00864d8d;
      }
LAB_00864c00:
      uVar6 = 0xc00000000;
      R0 = GetAndReleaseBinaryLocations<int>(this,&rhsEmit,&local_40);
      AsmJsByteCodeWriter::AsmReg3
                (&this->mWriter,*(OpCodeAsmJs *)(BinaryMathOpCodes + uVar3 * 2 + (long)(int)op * 8),
                 R0,rhsEmit.super_EmitInfoBase.location,local_40.super_EmitInfoBase.location);
      goto LAB_00864c4d;
    }
  }
  bVar1 = AsmJsType::isMaybeDouble(this_01);
  if (bVar1) {
    bVar1 = AsmJsType::isMaybeDouble(this_00);
    if (bVar1) {
      bVar1 = AsmJsFunc::IsValidLocation<double>(this->mFunction,&rhsEmit);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
        goto LAB_00864d8d;
      }
      bVar1 = AsmJsFunc::IsValidLocation<double>(this->mFunction,&local_40);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_00864d8d;
      }
      R0 = GetAndReleaseBinaryLocations<double>(this,&rhsEmit,&local_40);
      AsmJsByteCodeWriter::AsmReg3
                (&this->mWriter,*(OpCodeAsmJs *)(BinaryMathOpCodes + (long)(int)op * 8 + 6),R0,
                 rhsEmit.super_EmitInfoBase.location,local_40.super_EmitInfoBase.location);
      uVar6 = 0x200000000;
      goto LAB_00864c4d;
    }
  }
  bVar1 = AsmJsType::isMaybeFloat(this_01);
  if (bVar1) {
    bVar1 = AsmJsType::isMaybeFloat(this_00);
    if (bVar1) {
      if (((long)(int)op & 0x1fffffffffffffffU) == 4) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"invalid Binary float operation");
      }
      else {
        bVar1 = AsmJsFunc::IsValidLocation<float>(this->mFunction,&rhsEmit);
        if (bVar1) {
          bVar1 = AsmJsFunc::IsValidLocation<float>(this->mFunction,&local_40);
          if (bVar1) {
            R0 = GetAndReleaseBinaryLocations<float>(this,&rhsEmit,&local_40);
            AsmJsByteCodeWriter::AsmReg3
                      (&this->mWriter,*(OpCodeAsmJs *)(BinaryMathOpCodes + (long)(int)op * 8 + 4),R0
                       ,rhsEmit.super_EmitInfoBase.location,local_40.super_EmitInfoBase.location);
            uVar6 = 0x700000000;
LAB_00864c4d:
            ByteCodeWriter::EndStatement(&(this->mWriter).super_ByteCodeWriter,pnode);
            return (EmitExpressionInfo)(R0 | uVar6);
          }
          this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        }
        else {
          this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (this_02,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
        }
      }
      goto LAB_00864d8d;
    }
  }
  this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException(this_02,L"Unsupported math operation");
LAB_00864d8d:
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryMultiType( ParseNode * pnode, EBinaryMathOpCodes op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft(pnode);
        ParseNode* rhs = ParserWrapper::GetBinaryRight(pnode);

        EmitExpressionInfo lhsEmit = Emit( lhs );
        EmitExpressionInfo rhsEmit = Emit( rhs );
        AsmJsType& lType = lhsEmit.type;
        AsmJsType& rType = rhsEmit.type;

        // don't need coercion inside an a+b+c type expression
        if (op == BMO_ADD || op == BMO_SUB)
        {
            if (lType.GetWhich() == AsmJsType::Intish && (lhs->nop == knopAdd || lhs->nop == knopSub))
            {
                lType = AsmJsType::Int;
            }
            if (rType.GetWhich() == AsmJsType::Intish && (rhs->nop == knopAdd || rhs->nop == knopSub))
            {
                rType = AsmJsType::Int;
            }
        }

        EmitExpressionInfo emitInfo( AsmJsType::Double );
        StartStatement(pnode);
        if( lType.isInt() && rType.isInt() )
        {
            CheckNodeLocation( lhsEmit, int );
            CheckNodeLocation( rhsEmit, int );
            // because fixnum can be either signed or unsigned, use both lhs and rhs to infer sign
            auto opType = (lType.isSigned() && rType.isSigned()) ? BMOT_Int : BMOT_UInt;
            if (op == BMO_REM || op == BMO_DIV)
            {
                // div and rem must have explicit sign
                if (!(lType.isSigned() && rType.isSigned()) && !(lType.isUnsigned() && rType.isUnsigned()))
                {
                    throw AsmJsCompilationException(_u("arguments to / or %% must both be double?, float?, signed, or unsigned; %s and %s given"), lType.toChars(), rType.toChars());
                }
            }

            // try to reuse tmp register
            RegSlot intReg = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3(BinaryMathOpCodes[op][opType], intReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = intReg;
            emitInfo.type = AsmJsType::Intish;
        }
        else if (lType.isMaybeDouble() && rType.isMaybeDouble())
        {
            CheckNodeLocation( lhsEmit, double );
            CheckNodeLocation( rhsEmit, double );

            RegSlot dbReg = GetAndReleaseBinaryLocations<double>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3( BinaryMathOpCodes[op][BMOT_Double], dbReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = dbReg;
        }
        else if (lType.isMaybeFloat() && rType.isMaybeFloat())
        {
            if (BinaryMathOpCodes[op][BMOT_Float] == OpCodeAsmJs::Nop)
            {
                throw AsmJsCompilationException(_u("invalid Binary float operation"));
            }

            CheckNodeLocation(lhsEmit, float);
            CheckNodeLocation(rhsEmit, float);

            RegSlot floatReg = GetAndReleaseBinaryLocations<float>(&lhsEmit, &rhsEmit);
            mWriter.AsmReg3(BinaryMathOpCodes[op][BMOT_Float], floatReg, lhsEmit.location, rhsEmit.location);
            emitInfo.location = floatReg;
            emitInfo.type = AsmJsType::Floatish;
        }
        else
        {
            throw AsmJsCompilationException( _u("Unsupported math operation") );
        }
        EndStatement(pnode);
        return emitInfo;
    }